

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::prelu(tensor *dest,tensor *src,tensor *param)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  
  iVar4 = (*param->_vptr_tensor[2])(param);
  fVar1 = *(float *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*src->_vptr_tensor[2])(src);
  iVar5 = (*dest->_vptr_tensor[3])(dest);
  uVar3 = dest->m_size;
  for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
    fVar2 = *(float *)(CONCAT44(extraout_var_00,iVar4) + uVar6 * 4);
    *(uint *)(CONCAT44(extraout_var_01,iVar5) + uVar6 * 4) =
         ~-(uint)(0.0 < fVar2) & (uint)(fVar1 * fVar2) | (uint)fVar2 & -(uint)(0.0 < fVar2);
  }
  return;
}

Assistant:

void prelu (
            tensor& dest,
            const tensor& src,
            const tensor& param
        )
        {
            const float p = param.host()[0];
            const float* s = src.host();
            float* d = dest.host();
            for (size_t i = 0; i < dest.size(); ++i)
            {
                if (s[i] > 0)
                    d[i] = s[i];
                else
                    d[i] = p*s[i];
            }
        }